

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

clip_image_size
image_manipulation::calc_size_preserved_ratio
          (clip_image_size *inp_size,int align_size,int max_dimension)

{
  clip_image_size cVar1;
  clip_image_size cVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  cVar2.width = 0;
  cVar2.height = 0;
  cVar1.width = 0;
  cVar1.height = 0;
  if ((((0 < inp_size->width) && (0 < max_dimension)) && (0 < align_size)) &&
     (cVar2 = cVar1, 0 < inp_size->height)) {
    fVar4 = (float)inp_size->width;
    fVar5 = (float)inp_size->height;
    fVar6 = (float)max_dimension / fVar4;
    fVar3 = (float)max_dimension / fVar5;
    if (fVar6 <= fVar3) {
      fVar3 = fVar6;
    }
    if (1.0 <= fVar3) {
      fVar3 = 1.0;
    }
    cVar2.width = ((int)(fVar4 * fVar3) + align_size) - 1U & -align_size;
    cVar2.height = ((int)(fVar3 * fVar5) + align_size) - 1U & -align_size;
  }
  return cVar2;
}

Assistant:

static clip_image_size calc_size_preserved_ratio(const clip_image_size & inp_size, const int align_size, const int max_dimension) {
        if (inp_size.width <= 0 || inp_size.height <= 0 || align_size <= 0 || max_dimension <= 0) {
            return {0, 0};
        }

        float scale = std::min(1.0f, std::min(static_cast<float>(max_dimension) / inp_size.width,
                                              static_cast<float>(max_dimension) / inp_size.height));

        float target_width_f  = static_cast<float>(inp_size.width)  * scale;
        float target_height_f = static_cast<float>(inp_size.height) * scale;

        int aligned_width  = GGML_PAD((int)target_width_f,  align_size);
        int aligned_height = GGML_PAD((int)target_height_f, align_size);

        return {aligned_width, aligned_height};
    }